

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# i_timer.cpp
# Opt level: O2

double I_GetTimeFrac(uint32 *ms)

{
  DWORD DVar1;
  int iVar2;
  double dVar3;
  double dVar4;
  
  iVar2 = SDL_GetTicks();
  DVar1 = TicStart;
  if (ms != (uint32 *)0x0) {
    *ms = TicStart + 0x1c;
  }
  if (DVar1 == 0) {
    dVar4 = 1.0;
  }
  else {
    dVar3 = (double)((iVar2 - DVar1) * 0x23) / 1000.0;
    dVar4 = 1.0;
    if (dVar3 <= 1.0) {
      dVar4 = dVar3;
    }
    dVar4 = (double)(-(ulong)(0.0 < dVar3) & (ulong)dVar4);
  }
  return dVar4;
}

Assistant:

double I_GetTimeFrac (uint32 *ms)
{
	DWORD now = SDL_GetTicks ();
	if (ms) *ms = TicStart + (1000 / TICRATE);
	if (TicStart == 0)
	{
		return 1;
	}
	else
	{
		return clamp<double>((now - TicStart) * TICRATE / 1000., 0, 1);
	}
}